

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::unoptimizedPumpTo
          (kj *this,AsyncInputStream *input,AsyncOutputStream *output,uint64_t amount,
          uint64_t completedSoFar)

{
  undefined1 local_48 [8];
  Promise<unsigned_long> promise;
  Own<kj::(anonymous_namespace)::AsyncPump,_std::nullptr_t> pump;
  uint64_t completedSoFar_local;
  uint64_t amount_local;
  AsyncOutputStream *output_local;
  AsyncInputStream *input_local;
  
  pump.ptr = (AsyncPump *)completedSoFar;
  completedSoFar_local = amount;
  amount_local = (uint64_t)output;
  output_local = (AsyncOutputStream *)input;
  input_local = (AsyncInputStream *)this;
  heap<kj::(anonymous_namespace)::AsyncPump,kj::AsyncInputStream&,kj::AsyncOutputStream&,unsigned_long&,unsigned_long&>
            ((kj *)&promise,input,output,&completedSoFar_local,(unsigned_long *)&pump.ptr);
  Own<kj::(anonymous_namespace)::AsyncPump,_std::nullptr_t>::operator->
            ((Own<kj::(anonymous_namespace)::AsyncPump,_std::nullptr_t> *)&promise);
  anon_unknown_123::AsyncPump::pump((AsyncPump *)local_48);
  mv<kj::Own<kj::(anonymous_namespace)::AsyncPump,decltype(nullptr)>>
            ((Own<kj::(anonymous_namespace)::AsyncPump,_std::nullptr_t> *)&promise);
  Promise<unsigned_long>::attach<kj::Own<kj::(anonymous_namespace)::AsyncPump,decltype(nullptr)>>
            ((Promise<unsigned_long> *)this,
             (Own<kj::(anonymous_namespace)::AsyncPump,_std::nullptr_t> *)local_48);
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)local_48);
  Own<kj::(anonymous_namespace)::AsyncPump,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::AsyncPump,_std::nullptr_t> *)&promise);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<uint64_t> unoptimizedPumpTo(
    AsyncInputStream& input, AsyncOutputStream& output, uint64_t amount,
    uint64_t completedSoFar) {
  auto pump = heap<AsyncPump>(input, output, amount, completedSoFar);
  auto promise = pump->pump();
  return promise.attach(kj::mv(pump));
}